

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O3

void __thiscall vera::Vbo::~Vbo(Vbo *this)

{
  ~Vbo(this);
  operator_delete(this);
  return;
}

Assistant:

Vbo::~Vbo() {
    m_vertexData.clear();
    m_indices.clear();

    if (m_vertexLayout != NULL)
        delete m_vertexLayout;

    glDeleteBuffers(1, &m_glVertexBuffer);
    glDeleteBuffers(1, &m_glIndexBuffer);
}